

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall
HFSubConsumer::HFSubConsumer
          (HFSubConsumer *this,HighFreqDataType *hf,size_t bfsize,consumer_queue_filter filter)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict1 _Var2;
  int iVar3;
  ProducerBase *pPVar4;
  ConcurrentQueueProducerTypelessBase *pCVar5;
  bool recycled;
  bool local_b9;
  HighFreqDataType local_b8;
  
  HighFreqDataType::HighFreqDataType(&local_b8,hf);
  HighFreqSub::HighFreqSub(&this->super_HighFreqSub,&local_b8,ST_CONSUMER);
  HighFreqDataType::~HighFreqDataType(&local_b8);
  (this->super_HighFreqSub)._vptr_HighFreqSub = (_func_int **)&PTR__HFSubConsumer_003ed8f8;
  this->buffersize = bfsize + 1;
  iVar3 = HighFreqDataType::getByteSize(hf);
  this->msgsize = (long)iVar3;
  this->queuefilter = filter;
  moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ConcurrentQueue
            (&this->framequeue,this->buffersize,1,0);
  pPVar4 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::recycle_or_create_producer
                     (&this->framequeue,true,&local_b9);
  pCVar5 = &pPVar4->super_ConcurrentQueueProducerTypelessBase;
  if (pPVar4 == (ProducerBase *)0x0) {
    pCVar5 = (ConcurrentQueueProducerTypelessBase *)0x0;
  }
  (this->ptoken).producer = pCVar5;
  if (pPVar4 != (ProducerBase *)0x0) {
    pCVar5->token = &this->ptoken;
  }
  (this->replacetoken).itemsConsumedFromCurrent = 0;
  (this->replacetoken).currentProducer = (ConcurrentQueueProducerTypelessBase *)0x0;
  (this->replacetoken).desiredProducer = (ConcurrentQueueProducerTypelessBase *)0x0;
  LOCK();
  paVar1 = &(this->framequeue).nextExplicitConsumerId;
  _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  (this->replacetoken).initialOffset = _Var2;
  (this->replacetoken).lastKnownGlobalOffset = 0xffffffff;
  (this->consumetoken).itemsConsumedFromCurrent = 0;
  (this->consumetoken).currentProducer = (ConcurrentQueueProducerTypelessBase *)0x0;
  (this->consumetoken).desiredProducer = (ConcurrentQueueProducerTypelessBase *)0x0;
  LOCK();
  paVar1 = &(this->framequeue).nextExplicitConsumerId;
  _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  (this->consumetoken).initialOffset = _Var2;
  (this->consumetoken).lastKnownGlobalOffset = 0xffffffff;
  this->req = (zsock_t *)0x0;
  this->rep = (zsock_t *)0x0;
  (this->rependpoint)._M_dataplus._M_p = (pointer)&(this->rependpoint).field_2;
  (this->rependpoint)._M_string_length = 0;
  (this->rependpoint).field_2._M_local_buf[0] = '\0';
  this->waiting = false;
  this->lasttimestamp = 0;
  return;
}

Assistant:

HFSubConsumer::HFSubConsumer(HighFreqDataType hf, size_t bfsize, consumer_queue_filter filter)
    : HighFreqSub(hf, ST_CONSUMER),
      buffersize(bfsize+1),
      msgsize(hf.getByteSize()),
      queuefilter(filter),
      framequeue(buffersize, 1, 0),
      ptoken(framequeue),
      replacetoken(framequeue),
      consumetoken(framequeue),
      req(NULL),
      rep(NULL),
      waiting(false),
      lasttimestamp(0)
{

}